

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

void __thiscall runtime::VirtualMachine::ChatAt(VirtualMachine *this)

{
  element_type *peVar1;
  anon_union_8_6_52c89740_for_Variable_1 aVar2;
  undefined8 uVar3;
  Variable VVar4;
  Variable VVar5;
  
  VVar4 = popOpStack(this);
  VVar5 = popOpStack(this);
  if (((VVar5.type == String) && (VVar4.type == Integer)) &&
     (VVar4.field_1 < (Object *)((VVar5.field_1.objectValue)->properties)._M_h._M_bucket_count)) {
    aVar2.stringValue = Heap::NewString_abi_cxx11_(&this->heap);
    ((aVar2.objectValue)->properties)._M_h._M_bucket_count = 0;
    *(char *)((aVar2.objectValue)->properties)._M_h._M_buckets = '\0';
    std::__cxx11::string::push_back(aVar2.boolValue);
    uVar3 = 4;
  }
  else {
    uVar3 = 0;
    aVar2.integerValue = 0;
  }
  VVar4.field_1.integerValue = aVar2.integerValue;
  VVar4._0_8_ = uVar3;
  pushOpStack(this,VVar4);
  peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar1->programCounter = peVar1->programCounter + 1;
  return;
}

Assistant:

void runtime::VirtualMachine::ChatAt() {
  Variable second = this->popOpStack();
  Variable first = this->popOpStack();

  if (first.type != VariableType::String) {
    this->pushUndefined();
    this->advance();
    return;
  }

  if (second.type != VariableType::Integer) {
    this->pushUndefined();
    this->advance();
    return;
  }

  std::size_t index = static_cast<std::size_t>(second.integerValue);

  if (index >= first.stringValue->size()) {
    this->pushUndefined();
    this->advance();
    return;
  }

  char c = first.stringValue->at(index);

  auto str = this->heap.NewString();

  str->clear();
  *str += c;

  this->pushString(str);
  this->advance();
}